

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void __thiscall
util::exception::exception<std::__cxx11::string&>
          (exception *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  string local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  exception *this_local;
  
  local_18 = args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  make_string<std::__cxx11::string&>(&local_38,(util *)args,in_RDX);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)this = &PTR__exception_00301e18;
  return;
}

Assistant:

explicit exception(Args&& ... args)
        : std::runtime_error(make_string(std::forward<Args>(args)...)) {}